

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O3

void __thiscall
ncnn::cubic_coeffs(ncnn *this,int w,int outw,int *xofs,float *alpha,int align_corner)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 in_register_00000014;
  int iVar6;
  float *pfVar7;
  int iVar8;
  float *pfVar9;
  ulong uVar10;
  undefined8 in_XMM0_Qa;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  iVar8 = (int)this;
  if ((int)alpha == 0) {
    dVar12 = (double)w;
    iVar6 = iVar8;
  }
  else {
    dVar12 = (double)(w + -1);
    iVar6 = iVar8 + -1;
  }
  auVar11._0_8_ = (double)iVar6 / dVar12;
  auVar11._8_8_ = in_XMM0_Qa;
  if (0 < w) {
    pfVar9 = (float *)(xofs + 3);
    uVar10 = 0;
    auVar13._8_4_ = 0x3f800000;
    auVar13._0_8_ = 0x3f8000003f800000;
    auVar13._12_4_ = 0x3f800000;
    do {
      auVar15._8_8_ = 0;
      auVar15._0_8_ = (double)(int)uVar10 + 0.5;
      auVar16 = vfmadd213sd_fma(auVar15,auVar11,ZEXT816(0xbfe0000000000000));
      if ((int)alpha != 0) {
        auVar16._8_8_ = 0;
        auVar16._0_8_ = (double)(int)uVar10 * auVar11._0_8_;
      }
      auVar17._0_4_ = (float)auVar16._0_8_;
      auVar17._4_12_ = auVar16._4_12_;
      auVar16 = vroundss_avx(auVar17,auVar17,9);
      iVar6 = (int)auVar16._0_4_;
      fVar14 = auVar17._0_4_ - auVar16._0_4_;
      fVar5 = 1.0 - fVar14;
      auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0c00000),0),ZEXT416((uint)(fVar14 + 1.0)),
                                SUB6416(ZEXT464(0x40400000),0));
      auVar16 = vblendps_avx(auVar16,auVar13,0xe);
      auVar15 = vinsertps_avx(ZEXT416((uint)(fVar14 + 1.0)),ZEXT416((uint)fVar14),0x10);
      fVar14 = auVar15._0_4_;
      auVar20._0_4_ = fVar14 * fVar14;
      fVar2 = auVar15._4_4_;
      auVar20._4_4_ = fVar2 * fVar2;
      fVar3 = auVar15._8_4_;
      auVar20._8_4_ = fVar3 * fVar3;
      fVar4 = auVar15._12_4_;
      auVar20._12_4_ = fVar4 * fVar4;
      auVar18._0_4_ = fVar14 * 0.75;
      auVar18._4_4_ = fVar2 * 1.25;
      auVar18._8_4_ = fVar3 * 0.0;
      auVar18._12_4_ = fVar4 * 0.0;
      auVar15 = vsubps_avx(SUB6416(ZEXT464(0x40700000),0),auVar18);
      auVar19._0_4_ = auVar18._0_4_ + -2.25;
      auVar19._4_4_ = auVar18._4_4_ + -2.25;
      auVar19._8_4_ = auVar18._8_4_ + -2.25;
      auVar19._12_4_ = auVar18._12_4_ + -2.25;
      auVar15 = vblendps_avx(auVar15,auVar19,2);
      auVar16 = vfmadd213ps_fma(auVar15,auVar20,auVar16);
      fVar14 = auVar16._0_4_;
      uVar1 = vmovlps_avx(auVar16);
      *(undefined8 *)(pfVar9 + -3) = uVar1;
      auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar5),SUB6416(ZEXT464(0x3fa00000),0),
                                SUB6416(ZEXT464(0xc0100000),0));
      fVar2 = auVar15._0_4_ * fVar5 * fVar5;
      pfVar9[-1] = fVar2 + 1.0;
      auVar16 = vmovshdup_avx(auVar16);
      *pfVar9 = -(fVar14 + fVar2 + auVar16._0_4_);
      if (iVar6 < 0) {
        pfVar7 = (float *)(xofs + uVar10 * 4 + 3);
        fVar14 = 1.0 - *pfVar9;
        pfVar9[-3] = fVar14;
        pfVar9[-2] = *pfVar9;
        pfVar9[-1] = 0.0;
LAB_0042f848:
        *pfVar7 = 0.0;
        iVar6 = 1;
      }
      else if (iVar6 == 0) {
        fVar14 = fVar14 + pfVar9[-2];
        pfVar9[-3] = fVar14;
        *(undefined8 *)(pfVar9 + -2) = *(undefined8 *)(pfVar9 + -1);
        pfVar7 = pfVar9;
        goto LAB_0042f848;
      }
      if (iVar6 == iVar8 + -2) {
        *pfVar9 = *pfVar9 + pfVar9[-1];
        pfVar9[-1] = pfVar9[-2];
        pfVar9[-2] = fVar14;
LAB_0042f898:
        pfVar9[-3] = 0.0;
        iVar6 = iVar8 + -3;
      }
      else if (iVar8 + -1 <= iVar6) {
        *pfVar9 = 1.0 - fVar14;
        pfVar9[-1] = fVar14;
        pfVar9[-2] = 0.0;
        goto LAB_0042f898;
      }
      *(int *)(CONCAT44(in_register_00000014,outw) + uVar10 * 4) = iVar6;
      uVar10 = uVar10 + 1;
      pfVar9 = pfVar9 + 4;
    } while ((uint)w != uVar10);
  }
  return;
}

Assistant:

static void cubic_coeffs(int w, int outw, int* xofs, float* alpha, int align_corner)
{
    double scale = (double)w / outw;
    if (align_corner)
    {
        scale = (double)(w - 1) / (outw - 1);
    }

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        if (align_corner)
        {
            fx = static_cast<float>(dx * scale);
        }

        int sx = static_cast<int>(floor(fx));
        fx -= sx;

        interpolate_cubic(fx, alpha + dx * 4);

        if (sx <= -1)
        {
            sx = 1;
            alpha[dx * 4 + 0] = 1.f - alpha[dx * 4 + 3];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 3];
            alpha[dx * 4 + 2] = 0.f;
            alpha[dx * 4 + 3] = 0.f;
        }
        if (sx == 0)
        {
            sx = 1;
            alpha[dx * 4 + 0] = alpha[dx * 4 + 0] + alpha[dx * 4 + 1];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 2];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 3];
            alpha[dx * 4 + 3] = 0.f;
        }
        if (sx == w - 2)
        {
            sx = w - 3;
            alpha[dx * 4 + 3] = alpha[dx * 4 + 2] + alpha[dx * 4 + 3];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 1];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 0];
            alpha[dx * 4 + 0] = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 3;
            alpha[dx * 4 + 3] = 1.f - alpha[dx * 4 + 0];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 0];
            alpha[dx * 4 + 1] = 0.f;
            alpha[dx * 4 + 0] = 0.f;
        }

        xofs[dx] = sx;
    }
}